

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O0

DWORD __thiscall HMISong::TrackInfo::ReadVarLenHMP(TrackInfo *this)

{
  size_t sVar1;
  byte bVar2;
  bool bVar3;
  byte local_15;
  int off;
  BYTE t;
  DWORD time;
  TrackInfo *this_local;
  
  off = 0;
  local_15 = 0;
  bVar2 = 0;
  while( true ) {
    bVar3 = false;
    if ((local_15 & 0x80) == 0) {
      bVar3 = this->TrackP < this->MaxTrackP;
    }
    if (!bVar3) break;
    sVar1 = this->TrackP;
    this->TrackP = sVar1 + 1;
    local_15 = this->TrackBegin[sVar1];
    off = (local_15 & 0x7f) << (bVar2 & 0x1f) | off;
    bVar2 = bVar2 + 7;
  }
  return off;
}

Assistant:

DWORD HMISong::TrackInfo::ReadVarLenHMP()
{
	DWORD time = 0;
	BYTE t = 0;
	int off = 0;

	while (!(t & 0x80) && TrackP < MaxTrackP)
	{
		t = TrackBegin[TrackP++];
		time |= (t & 127) << off;
		off += 7;
	}
	return time;
}